

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<unsigned_long,int>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          int *out_value)

{
  ulong *puVar1;
  byte bVar2;
  ulong *puVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar5 = *(uint *)&this->num_components_;
  bVar2 = out_num_components;
  if ((byte)uVar5 < out_num_components) {
    bVar2 = (byte)uVar5;
  }
  bVar6 = bVar2 == 0;
  if (bVar6) {
LAB_00112d8a:
    if ((byte)uVar5 < out_num_components) {
      memset(out_value + (uVar5 & 0xff),0,
             (ulong)((uint)out_num_components + ~(uVar5 & 0xff)) * 4 + 4);
    }
  }
  else {
    puVar3 = (ulong *)((this->buffer_->data_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start +
                      this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
    puVar1 = (ulong *)(this->buffer_->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
    if (puVar3 < puVar1) {
      uVar4 = 1;
      do {
        if (0x7fffffff < *puVar3) {
          return bVar6;
        }
        out_value[uVar4 - 1] = (int)*puVar3;
        uVar5 = *(uint *)&this->num_components_;
        bVar2 = (byte)uVar5;
        if (out_num_components <= (byte)uVar5) {
          bVar2 = out_num_components;
        }
        bVar6 = bVar2 <= uVar4;
        if (bVar6) goto LAB_00112d8a;
        puVar3 = puVar3 + 1;
        uVar4 = uVar4 + 1;
      } while (puVar3 < puVar1);
    }
  }
  return bVar6;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }